

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::ComputeBuildFileGenerators(cmGlobalGenerator *this)

{
  cmExportBuildFileGenerator *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  reference ppcVar4;
  reference ppcVar5;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_48;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_40;
  __normal_iterator<cmExportBuildFileGenerator_*const_*,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_38;
  const_iterator it;
  vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> gens;
  uint i;
  cmGlobalGenerator *this_local;
  
  gens.
  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    if (sVar2 <= gens.
                 super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) break;
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,
                         (ulong)gens.
                                super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    cmMakefile::GetExportBuildFileGenerators
              ((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                *)&it,*ppcVar3);
    local_40._M_current =
         (cmExportBuildFileGenerator **)
         std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
         begin((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                *)&it);
    __gnu_cxx::
    __normal_iterator<cmExportBuildFileGenerator*const*,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>
    ::__normal_iterator<cmExportBuildFileGenerator**>
              ((__normal_iterator<cmExportBuildFileGenerator*const*,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>
                *)&local_38,&local_40);
    while( true ) {
      local_48._M_current =
           (cmExportBuildFileGenerator **)
           std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
           ::end((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                  *)&it);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmExportBuildFileGenerator_*const_*,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
                ::operator*(&local_38);
      this_00 = *ppcVar4;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,
                           (ulong)gens.
                                  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      cmExportBuildFileGenerator::Compute(this_00,*ppcVar5);
      __gnu_cxx::
      __normal_iterator<cmExportBuildFileGenerator_*const_*,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
      ::operator++(&local_38);
    }
    std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
    ~vector((vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_> *)
            &it);
    gens.
    super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         gens.
         super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeBuildFileGenerators()
{
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmExportBuildFileGenerator*> gens =
      this->Makefiles[i]->GetExportBuildFileGenerators();
    for (std::vector<cmExportBuildFileGenerator*>::const_iterator it =
           gens.begin();
         it != gens.end(); ++it) {
      (*it)->Compute(this->LocalGenerators[i]);
    }
  }
}